

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O0

void __thiscall QGraphicsDropShadowEffect::draw(QGraphicsDropShadowEffect *this,QPainter *painter)

{
  bool bVar1;
  QGraphicsDropShadowEffectPrivate *pQVar2;
  ulong uVar3;
  void *__src;
  QPointF *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  qreal qVar4;
  PixmapPadMode mode;
  QGraphicsDropShadowEffectPrivate *d;
  QPixmap pixmap;
  QPoint offset;
  QTransform restoreTransform;
  QPoint *in_stack_fffffffffffffea8;
  QPointF *in_stack_fffffffffffffeb0;
  QPointF *this_00;
  QPixmapDropShadowFilter *in_stack_fffffffffffffeb8;
  QPixmapDropShadowFilter *pQVar5;
  undefined8 in_stack_fffffffffffffec0;
  PixmapPadMode mode_00;
  QPointF *pQVar6;
  CoordinateSystem in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 uVar7;
  QRectF local_108;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  QPointF local_b8;
  undefined1 local_a8 [80];
  undefined1 local_58 [80];
  long local_8;
  
  mode_00 = (PixmapPadMode)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsDropShadowEffect *)0x4a4fe5);
  qVar4 = QPixmapDropShadowFilter::blurRadius((QPixmapDropShadowFilter *)in_stack_fffffffffffffeb0);
  in_stack_fffffffffffffed4 = in_stack_fffffffffffffed4 & 0xffffff;
  if (qVar4 <= 0.0) {
    local_b8 = QPixmapDropShadowFilter::offset(in_stack_fffffffffffffeb8);
    bVar1 = QPointF::isNull(in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffed4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffed4);
  }
  if ((char)(in_stack_fffffffffffffed4 >> 0x18) == '\0') {
    uVar7 = 2;
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffeb0);
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    local_d0 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsEffect::sourcePixmap
              ((QGraphicsEffect *)CONCAT44(uVar7,in_stack_fffffffffffffed8),
               in_stack_fffffffffffffed4,in_RDI,mode_00);
    uVar3 = QPixmap::isNull();
    if ((uVar3 & 1) == 0) {
      memcpy(local_58,&DAT_00b0d778,0x50);
      __src = (void *)QPainter::worldTransform();
      memcpy(local_58,__src,0x50);
      this_00 = in_RSI;
      QTransform::QTransform((QTransform *)in_RSI);
      QPainter::setWorldTransform((QTransform *)this_00,SUB81(local_a8,0));
      pQVar5 = pQVar2->filter;
      pQVar6 = in_RSI;
      QPointF::QPointF(this_00,in_stack_fffffffffffffea8);
      QRectF::QRectF(&local_108);
      (**(code **)(*(long *)&pQVar5->super_QPixmapFilter + 0x68))
                (pQVar5,pQVar6,local_e8,&local_d8,&local_108);
      QPainter::setWorldTransform((QTransform *)in_RSI,SUB81(local_58,0));
    }
    QPixmap::~QPixmap((QPixmap *)&local_d8);
  }
  else {
    QGraphicsEffect::drawSource
              ((QGraphicsEffect *)in_stack_fffffffffffffeb0,(QPainter *)in_stack_fffffffffffffea8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsDropShadowEffect::draw(QPainter *painter)
{
    Q_D(QGraphicsDropShadowEffect);
    if (d->filter->blurRadius() <= 0 && d->filter->offset().isNull()) {
        drawSource(painter);
        return;
    }

    PixmapPadMode mode = PadToEffectiveBoundingRect;

    // Draw pixmap in device coordinates to avoid pixmap scaling.
    QPoint offset;
    const QPixmap pixmap = sourcePixmap(Qt::DeviceCoordinates, &offset, mode);
    if (pixmap.isNull())
        return;

    QTransform restoreTransform = painter->worldTransform();
    painter->setWorldTransform(QTransform());
    d->filter->draw(painter, offset, pixmap);
    painter->setWorldTransform(restoreTransform);
}